

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  byte bVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  CommandLine<Catch::ConfigData> *this_00;
  undefined1 local_31 [49];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,libraryVersion);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,DAT_001f351c);
  poVar2 = std::operator<<(poVar2," build ");
  std::ostream::operator<<(poVar2,DAT_001f3520);
  this_00 = (CommandLine<Catch::ConfigData> *)local_31;
  poVar2 = DAT_001f3528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"master",(allocator *)this_00);
  bVar1 = std::operator!=((char *)in_RDI,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout," (");
    poVar3 = std::operator<<(poVar3,(char *)DAT_001f3528);
    std::operator<<(poVar3," branch)");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  Clara::CommandLine<Catch::ConfigData>::usage(this_00,poVar2,in_RDI);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "For more detail usage please see the project docs\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            std::cout << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                std::cout << " (" << libraryVersion.branchName << " branch)";
            std::cout << "\n";

            m_cli.usage( std::cout, processName );
            std::cout << "For more detail usage please see the project docs\n" << std::endl;
        }